

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode sendrecv_ul(Curl_easy *data,int *didwhat)

{
  _Bool _Var1;
  int *didwhat_local;
  Curl_easy *data_local;
  
  _Var1 = Curl_req_done_sending(data);
  if (_Var1) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    *didwhat = *didwhat | 2;
    data_local._4_4_ = Curl_req_send_more(data);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode sendrecv_ul(struct Curl_easy *data, int *didwhat)
{
  /* We should not get here when the sending is already done. It
   * probably means that someone set `data-req.keepon |= KEEP_SEND`
   * when it should not. */
  DEBUGASSERT(!Curl_req_done_sending(data));

  if(!Curl_req_done_sending(data)) {
    *didwhat |= KEEP_SEND;
    return Curl_req_send_more(data);
  }
  return CURLE_OK;
}